

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogOverlay.cpp
# Opt level: O2

void __thiscall cursespp::DialogOverlay::DialogOverlay(DialogOverlay *this)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<cursespp::ShortcutsWindow> *this_00;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  OverlayBase::OverlayBase(&this->super_OverlayBase);
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__DialogOverlay_001be588;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&PTR__DialogOverlay_001be810;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__DialogOverlay_001be840;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__DialogOverlay_001be868;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__DialogOverlay_001be890;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__DialogOverlay_001be938;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__DialogOverlay_001be960;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__DialogOverlay_001be988;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__DialogOverlay_001be9b8;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay =
       (_func_int **)&PTR__DialogOverlay_001be9e8;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  (this->message)._M_string_length = 0;
  (this->message).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->dismissCb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dismissCb).super__Function_base._M_functor + 8) = 0;
  (this->dismissCb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dismissCb)._M_invoker = (_Invoker_type)0x0;
  (this->buttons)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buttons)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->buttons)._M_t._M_impl.super__Rb_tree_header;
  (this->messageLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->messageLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messageLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buttons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->buttons)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->buttons)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Window::SetFrameVisible((Window *)this,true);
  local_58 = 0x1600;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[10])(this);
  local_60 = 0x1600;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[0xb])(this);
  local_68 = 0x1700;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[9])(this);
  local_70 = 0x1700;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[0xc])(this);
  this->width = 0;
  this->height = 0;
  this->autoDismiss = true;
  this->escDismiss = false;
  std::make_shared<cursespp::ShortcutsWindow>();
  this_00 = &this->shortcuts;
  std::__shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>,
             &local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  ShortcutsWindow::SetAlignment
            ((this_00->super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,AlignRight);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/DialogOverlay.cpp:60:41)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/DialogOverlay.cpp:60:41)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  ShortcutsWindow::SetChangedCallback
            ((this->shortcuts).
             super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (ChangedCallback *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ShortcutsWindow,void>
            (local_90,&this_00->
                       super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>);
  LayoutBase::AddWindow((LayoutBase *)this,(IWindowPtr *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  return;
}

Assistant:

DialogOverlay::DialogOverlay() {
    this->SetFrameVisible(true);
    this->SetFrameColor(Color::OverlayFrame);
    this->SetFocusedFrameColor(Color::OverlayFrame);
    this->SetContentColor(Color::OverlayContent);
    this->SetFocusedContentColor(Color::OverlayContent);

    this->width = this->height = 0;
    this->autoDismiss = true;
    this->escDismiss = false;

    this->shortcuts = std::make_shared<ShortcutsWindow>();
    this->shortcuts->SetAlignment(text::AlignRight);

    this->shortcuts->SetChangedCallback([this](std::string key) {
        this->ProcessKey(key);
    });

    this->LayoutBase::AddWindow(this->shortcuts);
}